

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O2

void __thiscall ZlibWriter::~ZlibWriter(ZlibWriter *this)

{
  this->_vptr_ZlibWriter = (_func_int **)&PTR__ZlibWriter_0010ad88;
  deflateEnd(&this->z);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

ZlibWriter::~ZlibWriter()
{
	deflateEnd(&z);
}